

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::HttpMethod> kj::tryParseHttpMethod(StringPtr name)

{
  undefined4 uVar1;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *pMVar2;
  undefined4 in_ECX;
  size_t in_RDX;
  undefined4 uVar3;
  NullableValue<kj::HttpMethod> NVar4;
  StringPtr name_00;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> local_28;
  
  name_00.content.ptr = (char *)name.content.size_;
  NVar4 = (NullableValue<kj::HttpMethod>)name.content.ptr;
  name_00.content.size_ = in_RDX;
  pMVar2 = tryParseHttpMethodAllowingConnect(&local_28,name_00);
  uVar1 = (int)pMVar2;
  uVar3 = local_28.ptr.field_1.value.tag;
  if (local_28.ptr.isSet == true) {
    if (local_28.ptr.field_1.value.tag == 1) {
      uVar3 = 0;
    }
    in_ECX = local_28.ptr.field_1.value.tag;
    uVar1 = local_28.ptr.field_1._8_4_;
    if (uVar3 == 2) {
      uVar3 = 0;
    }
  }
  local_28.ptr.field_1.value.tag = uVar3;
  if ((local_28.ptr.isSet == false) || (in_ECX == 2)) {
    *(undefined1 *)NVar4 = 0;
  }
  else {
    if (in_ECX != 1) {
      _::unreachable();
    }
    *(undefined1 *)NVar4 = 1;
    *(undefined4 *)((long)NVar4 + 4) = uVar1;
  }
  return (Maybe<kj::HttpMethod>)NVar4;
}

Assistant:

kj::Maybe<HttpMethod> tryParseHttpMethod(kj::StringPtr name) {
  KJ_IF_SOME(method, tryParseHttpMethodAllowingConnect(name)) {
    KJ_SWITCH_ONEOF(method) {
      KJ_CASE_ONEOF(m, HttpMethod) { return m; }
      KJ_CASE_ONEOF(m, HttpConnectMethod) { return kj::none; }
    }
    KJ_UNREACHABLE;
  } else {
    return kj::none;
  }